

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx512bw_adder_forest(uint16_t *array,uint32_t len,uint32_t *flags)

{
  ushort uVar1;
  uint uVar2;
  size_t i_1;
  long lVar3;
  uint16_t *puVar4;
  int j_1;
  ulong uVar5;
  ulong uVar6;
  size_t i;
  uint32_t uVar7;
  int j;
  long lVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  uint16_t tmp [32];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_a0 [2] [64];
  
  for (lVar3 = 0; lVar3 != 0x400; lVar3 = lVar3 + 0x40) {
    *(undefined8 *)(local_680 + lVar3) = 0;
    *(undefined8 *)(local_680 + lVar3 + 8) = 0;
    *(undefined8 *)(local_680 + lVar3 + 0x10) = 0;
    *(undefined8 *)(local_680 + lVar3 + 0x18) = 0;
    *(undefined8 *)(local_680 + lVar3 + 0x20) = 0;
    *(undefined8 *)(local_680 + lVar3 + 0x28) = 0;
    *(undefined8 *)(local_680 + lVar3 + 0x30) = 0;
    *(undefined8 *)(local_680 + lVar3 + 0x38) = 0;
  }
  auVar9 = vpbroadcastb_avx512bw(ZEXT116(0x55));
  auVar10 = vpbroadcastb_avx512bw(ZEXT116(0x33));
  auVar11 = vpbroadcastb_avx512bw(ZEXT116(7));
  uVar2 = len >> 0x14;
  puVar4 = array + 0x1e0;
  for (uVar5 = 0; uVar5 != uVar2; uVar5 = uVar5 + 1) {
    auVar12 = vmovdqa64_avx512f(local_680);
    auVar13 = vmovdqa64_avx512f(local_640);
    auVar14 = vmovdqa64_avx512f(local_600);
    auVar15 = vmovdqa64_avx512f(local_5c0);
    auVar16 = vmovdqa64_avx512f(local_580);
    auVar17 = vmovdqa64_avx512f(local_540);
    auVar18 = vmovdqa64_avx512f(local_500);
    auVar19 = vmovdqa64_avx512f(local_4c0);
    auVar20 = vmovdqa64_avx512f(local_480);
    auVar21 = vmovdqa64_avx512f(local_440);
    auVar22 = vmovdqa64_avx512f(local_400);
    auVar23 = vmovdqa64_avx512f(local_3c0);
    auVar24 = vmovdqa64_avx512f(local_380);
    auVar25 = vmovdqa64_avx512f(local_340);
    auVar26 = vmovdqa64_avx512f(local_300);
    auVar27 = vmovdqa64_avx512f(local_2c0);
    lVar3 = 0;
    while (lVar3 != 0x200000) {
      auVar28 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar4 + lVar3 + -0x3c0));
      auVar29 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar4 + lVar3 + -0x380));
      auVar27 = vmovdqa64_avx512f(auVar27);
      auVar30 = vmovdqa64_avx512f(auVar20);
      auVar31 = vmovdqa64_avx512f(auVar16);
      auVar32 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar4 + lVar3 + -0x300));
      auVar33 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar4 + lVar3 + -0x340));
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar34 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar4 + lVar3 + -0x2c0));
      auVar35 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar4 + lVar3 + -0x280));
      auVar16 = vmovdqa64_avx512f(auVar24);
      auVar20 = vmovdqa64_avx512f(auVar21);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar21 = vmovdqa64_avx512f(auVar13);
      auVar24 = vmovdqa64_avx512f(auVar17);
      auVar36 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar4 + lVar3 + -0x240));
      auVar37 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar4 + lVar3 + -0x200));
      auVar13 = vmovdqa64_avx512f(auVar26);
      auVar17 = vmovdqa64_avx512f(auVar23);
      auVar23 = vmovdqa64_avx512f(auVar12);
      auVar26 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar4 + lVar3 + -0x1c0));
      auVar38 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar4 + lVar3 + -0x180));
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar39 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar4 + lVar3 + -0x140));
      auVar40 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar4 + lVar3 + -0x100));
      auVar41 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar4 + lVar3 + -0xc0));
      auVar42 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar4 + lVar3 + -0x80));
      auVar12 = vmovdqa64_avx512f(auVar22);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar22 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar4 + lVar3 + -0x40));
      auVar43 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar4 + lVar3));
      lVar3 = lVar3 + 0x400;
      auVar44 = vpandq_avx512f(auVar28,auVar9);
      auVar45 = vpandq_avx512f(auVar29,auVar9);
      auVar28 = vpsrlw_avx512bw(auVar28,1);
      auVar29 = vpsrlw_avx512bw(auVar29,1);
      auVar46 = vpandq_avx512f(auVar32,auVar9);
      auVar32 = vpsrlw_avx512bw(auVar32,1);
      auVar28 = vpandq_avx512f(auVar28,auVar9);
      auVar29 = vpandq_avx512f(auVar29,auVar9);
      auVar44 = vpaddb_avx512bw(auVar45,auVar44);
      auVar28 = vpaddb_avx512bw(auVar29,auVar28);
      auVar29 = vpandq_avx512f(auVar33,auVar9);
      auVar32 = vpandq_avx512f(auVar32,auVar9);
      auVar45 = vpsrlw_avx512bw(auVar35,1);
      auVar29 = vpaddb_avx512bw(auVar46,auVar29);
      auVar33 = vpsrlw_avx512bw(auVar33,1);
      auVar35 = vpandq_avx512f(auVar35,auVar9);
      auVar33 = vpandq_avx512f(auVar33,auVar9);
      auVar32 = vpaddb_avx512bw(auVar32,auVar33);
      auVar33 = vpandq_avx512f(auVar34,auVar9);
      auVar45 = vpandq_avx512f(auVar45,auVar9);
      auVar46 = vpsrlw_avx512bw(auVar37,1);
      auVar33 = vpaddb_avx512bw(auVar35,auVar33);
      auVar34 = vpsrlw_avx512bw(auVar34,1);
      auVar35 = vpandq_avx512f(auVar37,auVar9);
      auVar34 = vpandq_avx512f(auVar34,auVar9);
      auVar34 = vpaddb_avx512bw(auVar45,auVar34);
      auVar37 = vpandq_avx512f(auVar36,auVar9);
      auVar45 = vpandq_avx512f(auVar46,auVar9);
      auVar46 = vpsrlw_avx512bw(auVar38,1);
      auVar35 = vpaddb_avx512bw(auVar35,auVar37);
      auVar36 = vpsrlw_avx512bw(auVar36,1);
      auVar37 = vpandq_avx512f(auVar38,auVar9);
      auVar36 = vpandq_avx512f(auVar36,auVar9);
      auVar36 = vpaddb_avx512bw(auVar45,auVar36);
      auVar38 = vpandq_avx512f(auVar26,auVar9);
      auVar45 = vpandq_avx512f(auVar46,auVar9);
      auVar46 = vpsrlw_avx512bw(auVar40,1);
      auVar37 = vpaddb_avx512bw(auVar37,auVar38);
      auVar26 = vpsrlw_avx512bw(auVar26,1);
      auVar38 = vpandq_avx512f(auVar40,auVar9);
      auVar40 = vpandq_avx512f(auVar42,auVar9);
      auVar26 = vpandq_avx512f(auVar26,auVar9);
      auVar26 = vpaddb_avx512bw(auVar45,auVar26);
      auVar45 = vpandq_avx512f(auVar39,auVar9);
      auVar46 = vpandq_avx512f(auVar46,auVar9);
      auVar47 = vpsrlw_avx512bw(auVar44,2);
      auVar38 = vpaddb_avx512bw(auVar38,auVar45);
      auVar39 = vpsrlw_avx512bw(auVar39,1);
      auVar45 = vpsrlw_avx512bw(auVar33,2);
      auVar39 = vpandq_avx512f(auVar39,auVar9);
      auVar39 = vpaddb_avx512bw(auVar46,auVar39);
      auVar46 = vpandq_avx512f(auVar41,auVar9);
      auVar40 = vpaddb_avx512bw(auVar40,auVar46);
      auVar41 = vpsrlw_avx512bw(auVar41,1);
      auVar42 = vpsrlw_avx512bw(auVar42,1);
      auVar46 = vpandq_avx512f(auVar22,auVar9);
      auVar22 = vpsrlw_avx512bw(auVar22,1);
      auVar42 = vpandq_avx512f(auVar42,auVar9);
      auVar48 = vpandq_avx512f(auVar43,auVar9);
      auVar41 = vpandq_avx512f(auVar41,auVar9);
      auVar46 = vpaddb_avx512bw(auVar48,auVar46);
      auVar43 = vpsrlw_avx512bw(auVar43,1);
      auVar41 = vpaddb_avx512bw(auVar42,auVar41);
      auVar22 = vpandq_avx512f(auVar22,auVar9);
      auVar42 = vpandq_avx512f(auVar44,auVar10);
      auVar44 = vpandq_avx512f(auVar29,auVar10);
      auVar43 = vpandq_avx512f(auVar43,auVar9);
      auVar22 = vpaddb_avx512bw(auVar43,auVar22);
      auVar42 = vpaddb_avx512bw(auVar44,auVar42);
      auVar29 = vpsrlw_avx512bw(auVar29,2);
      auVar43 = vpandq_avx512f(auVar47,auVar10);
      auVar44 = vpandq_avx512f(auVar35,auVar10);
      auVar47 = vpandq_avx512f(auVar38,auVar10);
      auVar29 = vpandq_avx512f(auVar29,auVar10);
      auVar29 = vpaddb_avx512bw(auVar29,auVar43);
      auVar33 = vpandq_avx512f(auVar33,auVar10);
      auVar43 = vpandq_avx512f(auVar45,auVar10);
      auVar45 = vpsrlw_avx512bw(auVar37,2);
      auVar33 = vpaddb_avx512bw(auVar44,auVar33);
      auVar35 = vpsrlw_avx512bw(auVar35,2);
      auVar38 = vpsrlw_avx512bw(auVar38,2);
      auVar35 = vpandq_avx512f(auVar35,auVar10);
      auVar38 = vpandq_avx512f(auVar38,auVar10);
      auVar35 = vpaddb_avx512bw(auVar35,auVar43);
      auVar37 = vpandq_avx512f(auVar37,auVar10);
      auVar43 = vpandq_avx512f(auVar46,auVar10);
      auVar44 = vpsrlw_avx512bw(auVar46,2);
      auVar45 = vpandq_avx512f(auVar45,auVar10);
      auVar46 = vpsrlw_avx512bw(auVar28,2);
      auVar37 = vpaddb_avx512bw(auVar47,auVar37);
      auVar47 = vpandq_avx512f(auVar40,auVar10);
      auVar40 = vpsrlw_avx512bw(auVar40,2);
      auVar44 = vpandq_avx512f(auVar44,auVar10);
      auVar38 = vpaddb_avx512bw(auVar38,auVar45);
      auVar40 = vpandq_avx512f(auVar40,auVar10);
      auVar43 = vpaddb_avx512bw(auVar43,auVar47);
      auVar45 = vpandq_avx512f(auVar32,auVar10);
      auVar40 = vpaddb_avx512bw(auVar44,auVar40);
      auVar28 = vpandq_avx512f(auVar28,auVar10);
      auVar44 = vpandq_avx512f(auVar46,auVar10);
      auVar46 = vpandq_avx512f(auVar36,auVar10);
      auVar28 = vpaddb_avx512bw(auVar45,auVar28);
      auVar32 = vpsrlw_avx512bw(auVar32,2);
      auVar36 = vpsrlw_avx512bw(auVar36,2);
      auVar32 = vpandq_avx512f(auVar32,auVar10);
      auVar45 = vpsrlw_avx512bw(auVar34,2);
      auVar36 = vpandq_avx512f(auVar36,auVar10);
      auVar32 = vpaddb_avx512bw(auVar32,auVar44);
      auVar44 = vpandq_avx512f(auVar45,auVar10);
      auVar45 = vpandq_avx512f(auVar39,auVar10);
      auVar34 = vpandq_avx512f(auVar34,auVar10);
      auVar39 = vpsrlw_avx512bw(auVar39,2);
      auVar36 = vpaddb_avx512bw(auVar36,auVar44);
      auVar44 = vpandq_avx512f(auVar26,auVar10);
      auVar12 = vpandq_avx512f(auVar39,auVar10);
      auVar12 = vpaddb_avx512bw(auVar46,auVar34);
      auVar12 = vpandq_avx512f(auVar22,auVar10);
      auVar12 = vpsrlw_avx512bw(auVar22,2);
      auVar12 = vpaddb_avx512bw(auVar45,auVar44);
      auVar12 = vpsrlw_avx512bw(auVar26,2);
      auVar12 = vpandq_avx512f(auVar12,auVar10);
      auVar12 = vpandq_avx512f(auVar12,auVar10);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar41,auVar10);
      auVar12 = vpsrlw_avx512bw(auVar41,2);
      auVar12 = vpandq_avx512f(auVar42,auVar11);
      auVar12 = vpsrlw_avx512bw(auVar42,4);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar33,auVar11);
      auVar12 = vpandq_avx512f(auVar12,auVar10);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar33,4);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpandq_avx512f(auVar43,auVar11);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar37,auVar11);
      auVar12 = vpsrlw_avx512bw(auVar37,4);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar43,4);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpandq_avx512f(auVar29,auVar11);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar28,auVar11);
      auVar12 = vpsrlw_avx512bw(auVar28,4);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,4);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpsrlw_avx512bw(auVar12,4);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpsrlw_avx512bw(auVar29,4);
      auVar12 = vpsrlw_avx512bw(auVar38,4);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,4);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpandq_avx512f(auVar35,auVar11);
      auVar12 = vpandq_avx512f(auVar38,auVar11);
      auVar12 = vpsrlw_avx512bw(auVar32,4);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar35,4);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpandq_avx512f(auVar40,auVar11);
      auVar12 = vpandq_avx512f(auVar32,auVar11);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar40,4);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpandq_avx512f(auVar36,auVar11);
      auVar12 = vpsrlw_avx512bw(auVar12,8);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar36,4);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpsrlw_avx512bw(auVar12,4);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,4);
      auVar12 = vpbroadcastw_avx512bw(ZEXT216(0xf));
      auVar12 = vpandq_avx512f(auVar12,auVar11);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,8);
      auVar12 = vpandq_avx512f(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,8);
      auVar12 = vpandq_avx512f(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,8);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,8);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,8);
      auVar12 = vpsrlw_avx512bw(auVar12,8);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,8);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,8);
      auVar13 = vpaddw_avx512bw(auVar21,auVar12);
      auVar12 = vmovdqa64_avx512f(auVar20);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,8);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,8);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,8);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,8);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,8);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar16 = vpaddw_avx512bw(auVar31,auVar12);
      auVar20 = vpaddw_avx512bw(auVar30,auVar12);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar12 = vmovdqa64_avx512f(auVar27);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar12,auVar12);
      auVar12 = vpandq_avx512f(auVar12,auVar12);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,8);
      auVar12 = vpsrlw_avx512bw(auVar12,8);
      auVar25 = vpaddw_avx512bw(auVar25,auVar12);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar12 = vpaddw_avx512bw(auVar23,auVar12);
      auVar12 = vmovdqa64_avx512f(auVar15);
      auVar12 = vmovdqa64_avx512f(auVar14);
      auVar12 = vpaddb_avx512bw(auVar12,auVar12);
      auVar17 = vpaddw_avx512bw(auVar24,auVar12);
      auVar12 = vmovdqa64_avx512f(auVar16);
      auVar21 = vpaddw_avx512bw(auVar12,auVar12);
      auVar27 = vpaddw_avx512bw(auVar12,auVar12);
      auVar14 = vpaddw_avx512bw(auVar12,auVar12);
      auVar12 = vmovdqa64_avx512f(auVar17);
      auVar15 = vpaddw_avx512bw(auVar12,auVar12);
      auVar18 = vpaddw_avx512bw(auVar18,auVar12);
      auVar12 = vmovdqa64_avx512f(auVar13);
      auVar19 = vpaddw_avx512bw(auVar19,auVar12);
      auVar22 = vpaddw_avx512bw(auVar12,auVar12);
      auVar24 = vpaddw_avx512bw(auVar12,auVar12);
      auVar23 = vpaddw_avx512bw(auVar12,auVar12);
      auVar26 = vpaddw_avx512bw(auVar12,auVar12);
    }
    local_680 = vmovdqa64_avx512f(auVar12);
    local_640 = vmovdqa64_avx512f(auVar13);
    local_600 = vmovdqa64_avx512f(auVar14);
    local_5c0 = vmovdqa64_avx512f(auVar15);
    local_580 = vmovdqa64_avx512f(auVar16);
    local_540 = vmovdqa64_avx512f(auVar17);
    local_500 = vmovdqa64_avx512f(auVar18);
    local_4c0 = vmovdqa64_avx512f(auVar19);
    local_480 = vmovdqa64_avx512f(auVar20);
    local_440 = vmovdqa64_avx512f(auVar21);
    local_400 = vmovdqa64_avx512f(auVar22);
    local_3c0 = vmovdqa64_avx512f(auVar23);
    local_380 = vmovdqa64_avx512f(auVar24);
    local_340 = vmovdqa64_avx512f(auVar25);
    local_300 = vmovdqa64_avx512f(auVar26);
    lVar3 = 0;
    local_2c0 = vmovdqa64_avx512f(auVar27);
    for (; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      lVar8 = 0;
      auVar12 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_680 + lVar3 * 0x40));
      local_a0[0] = vmovdqu64_avx512f(auVar12);
      uVar7 = flags[lVar3];
      for (; lVar8 != 0x20; lVar8 = lVar8 + 1) {
        uVar7 = uVar7 + *(ushort *)(local_a0[0] + lVar8 * 2);
      }
      flags[lVar3] = uVar7;
    }
    for (lVar3 = 0; lVar3 != 0x400; lVar3 = lVar3 + 0x40) {
      auVar12 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      *(undefined1 (*) [64])(local_680 + lVar3) = auVar12;
    }
    puVar4 = puVar4 + 0x100000;
  }
  auVar12 = vmovdqa64_avx512f(local_680);
  auVar13 = vmovdqa64_avx512f(local_640);
  auVar14 = vmovdqa64_avx512f(local_600);
  auVar15 = vmovdqa64_avx512f(local_5c0);
  auVar16 = vmovdqa64_avx512f(local_580);
  auVar17 = vmovdqa64_avx512f(local_540);
  auVar18 = vmovdqa64_avx512f(local_500);
  auVar19 = vmovdqa64_avx512f(local_4c0);
  auVar20 = vmovdqa64_avx512f(local_480);
  auVar21 = vmovdqa64_avx512f(local_440);
  auVar22 = vmovdqa64_avx512f(local_400);
  auVar23 = vmovdqa64_avx512f(local_3c0);
  auVar24 = vmovdqa64_avx512f(local_380);
  auVar25 = vmovdqa64_avx512f(local_340);
  auVar26 = vmovdqa64_avx512f(local_300);
  auVar27 = vpbroadcastw_avx512bw(ZEXT216(0xf));
  uVar6 = (ulong)(uVar2 << 0xb);
  uVar5 = (ulong)(uVar2 << 0x14);
  while (uVar6 < len >> 9) {
    local_6c0._8_8_ = local_2c0._8_8_;
    local_6c0._0_8_ = local_2c0._0_8_;
    local_6c0._16_8_ = local_2c0._16_8_;
    local_6c0._24_8_ = local_2c0._24_8_;
    local_6c0._32_8_ = local_2c0._32_8_;
    local_6c0._40_8_ = local_2c0._40_8_;
    local_6c0._48_8_ = local_2c0._48_8_;
    local_6c0._56_8_ = local_2c0._56_8_;
    auVar28 = vmovdqu64_avx512f(*(undefined1 (*) [64])(array + uVar5 + 0x20));
    auVar29 = vmovdqu64_avx512f(*(undefined1 (*) [64])(array + uVar5));
    auVar30 = vmovdqu64_avx512f(*(undefined1 (*) [64])(array + uVar5 + 0x40));
    auVar31 = vmovdqu64_avx512f(*(undefined1 (*) [64])(array + uVar5 + 0x60));
    auVar32 = vmovdqu64_avx512f(*(undefined1 (*) [64])(array + uVar5 + 0x80));
    auVar33 = vmovdqu64_avx512f(*(undefined1 (*) [64])(array + uVar5 + 0xa0));
    auVar26 = vmovdqa64_avx512f(auVar26);
    auVar34 = vmovdqu64_avx512f(*(undefined1 (*) [64])(array + uVar5 + 0xc0));
    auVar35 = vmovdqu64_avx512f(*(undefined1 (*) [64])(array + uVar5 + 0xe0));
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar36 = vmovdqu64_avx512f(*(undefined1 (*) [64])(array + uVar5 + 0x100));
    auVar37 = vmovdqu64_avx512f(*(undefined1 (*) [64])(array + uVar5 + 0x120));
    auVar24 = vmovdqa64_avx512f(auVar24);
    auVar38 = vmovdqu64_avx512f(*(undefined1 (*) [64])(array + uVar5 + 0x140));
    auVar39 = vmovdqu64_avx512f(*(undefined1 (*) [64])(array + uVar5 + 0x160));
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar40 = vmovdqu64_avx512f(*(undefined1 (*) [64])(array + uVar5 + 0x180));
    auVar41 = vmovdqu64_avx512f(*(undefined1 (*) [64])(array + uVar5 + 0x1a0));
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar42 = vmovdqa64_avx512f(auVar22);
    auVar22 = vmovdqa64_avx512f(auVar23);
    auVar43 = vmovdqu64_avx512f(*(undefined1 (*) [64])(array + uVar5 + 0x1c0));
    auVar44 = vmovdqu64_avx512f(*(undefined1 (*) [64])(array + uVar5 + 0x1e0));
    auVar23 = vmovdqa64_avx512f(auVar25);
    auVar20 = vmovdqa64_avx512f(auVar20);
    uVar6 = uVar6 + 1;
    uVar5 = uVar5 + 0x200;
    auVar25 = vpandq_avx512f(auVar29,auVar9);
    auVar45 = vpandq_avx512f(auVar28,auVar9);
    auVar29 = vpsrlw_avx512bw(auVar29,1);
    auVar28 = vpsrlw_avx512bw(auVar28,1);
    auVar29 = vpandq_avx512f(auVar29,auVar9);
    auVar28 = vpandq_avx512f(auVar28,auVar9);
    auVar25 = vpaddb_avx512bw(auVar45,auVar25);
    auVar28 = vpaddb_avx512bw(auVar28,auVar29);
    auVar29 = vpandq_avx512f(auVar30,auVar9);
    auVar45 = vpandq_avx512f(auVar31,auVar9);
    auVar29 = vpaddb_avx512bw(auVar45,auVar29);
    auVar30 = vpsrlw_avx512bw(auVar30,1);
    auVar31 = vpsrlw_avx512bw(auVar31,1);
    auVar45 = vpandq_avx512f(auVar33,auVar9);
    auVar30 = vpandq_avx512f(auVar30,auVar9);
    auVar31 = vpandq_avx512f(auVar31,auVar9);
    auVar30 = vpaddb_avx512bw(auVar31,auVar30);
    auVar31 = vpandq_avx512f(auVar32,auVar9);
    auVar31 = vpaddb_avx512bw(auVar45,auVar31);
    auVar32 = vpsrlw_avx512bw(auVar32,1);
    auVar33 = vpsrlw_avx512bw(auVar33,1);
    auVar45 = vpandq_avx512f(auVar35,auVar9);
    auVar32 = vpandq_avx512f(auVar32,auVar9);
    auVar33 = vpandq_avx512f(auVar33,auVar9);
    auVar32 = vpaddb_avx512bw(auVar33,auVar32);
    auVar33 = vpandq_avx512f(auVar34,auVar9);
    auVar33 = vpaddb_avx512bw(auVar45,auVar33);
    auVar34 = vpsrlw_avx512bw(auVar34,1);
    auVar35 = vpsrlw_avx512bw(auVar35,1);
    auVar45 = vpandq_avx512f(auVar37,auVar9);
    auVar34 = vpandq_avx512f(auVar34,auVar9);
    auVar35 = vpandq_avx512f(auVar35,auVar9);
    auVar34 = vpaddb_avx512bw(auVar35,auVar34);
    auVar35 = vpandq_avx512f(auVar36,auVar9);
    auVar35 = vpaddb_avx512bw(auVar45,auVar35);
    auVar36 = vpsrlw_avx512bw(auVar36,1);
    auVar37 = vpsrlw_avx512bw(auVar37,1);
    auVar45 = vpandq_avx512f(auVar39,auVar9);
    auVar36 = vpandq_avx512f(auVar36,auVar9);
    auVar37 = vpandq_avx512f(auVar37,auVar9);
    auVar36 = vpaddb_avx512bw(auVar37,auVar36);
    auVar37 = vpandq_avx512f(auVar38,auVar9);
    auVar37 = vpaddb_avx512bw(auVar45,auVar37);
    auVar38 = vpsrlw_avx512bw(auVar38,1);
    auVar39 = vpsrlw_avx512bw(auVar39,1);
    auVar45 = vpandq_avx512f(auVar41,auVar9);
    auVar38 = vpandq_avx512f(auVar38,auVar9);
    auVar39 = vpandq_avx512f(auVar39,auVar9);
    auVar38 = vpaddb_avx512bw(auVar39,auVar38);
    auVar39 = vpandq_avx512f(auVar40,auVar9);
    auVar39 = vpaddb_avx512bw(auVar45,auVar39);
    auVar40 = vpsrlw_avx512bw(auVar40,1);
    auVar41 = vpsrlw_avx512bw(auVar41,1);
    auVar45 = vpandq_avx512f(auVar43,auVar9);
    auVar43 = vpsrlw_avx512bw(auVar43,1);
    auVar41 = vpandq_avx512f(auVar41,auVar9);
    auVar46 = vpandq_avx512f(auVar44,auVar9);
    auVar40 = vpandq_avx512f(auVar40,auVar9);
    auVar45 = vpaddb_avx512bw(auVar46,auVar45);
    auVar44 = vpsrlw_avx512bw(auVar44,1);
    auVar40 = vpaddb_avx512bw(auVar41,auVar40);
    auVar41 = vpandq_avx512f(auVar43,auVar9);
    auVar43 = vpandq_avx512f(auVar25,auVar10);
    auVar46 = vpandq_avx512f(auVar29,auVar10);
    auVar25 = vpsrlw_avx512bw(auVar25,2);
    auVar44 = vpandq_avx512f(auVar44,auVar9);
    auVar41 = vpaddb_avx512bw(auVar44,auVar41);
    auVar43 = vpaddb_avx512bw(auVar46,auVar43);
    auVar29 = vpsrlw_avx512bw(auVar29,2);
    auVar25 = vpandq_avx512f(auVar25,auVar10);
    auVar44 = vpandq_avx512f(auVar33,auVar10);
    auVar29 = vpandq_avx512f(auVar29,auVar10);
    auVar25 = vpaddb_avx512bw(auVar29,auVar25);
    auVar29 = vpandq_avx512f(auVar31,auVar10);
    auVar31 = vpsrlw_avx512bw(auVar31,2);
    auVar29 = vpaddb_avx512bw(auVar44,auVar29);
    auVar33 = vpsrlw_avx512bw(auVar33,2);
    auVar31 = vpandq_avx512f(auVar31,auVar10);
    auVar44 = vpandq_avx512f(auVar37,auVar10);
    auVar33 = vpandq_avx512f(auVar33,auVar10);
    auVar31 = vpaddb_avx512bw(auVar33,auVar31);
    auVar33 = vpandq_avx512f(auVar35,auVar10);
    auVar35 = vpsrlw_avx512bw(auVar35,2);
    auVar33 = vpaddb_avx512bw(auVar44,auVar33);
    auVar37 = vpsrlw_avx512bw(auVar37,2);
    auVar35 = vpandq_avx512f(auVar35,auVar10);
    auVar44 = vpandq_avx512f(auVar45,auVar10);
    auVar46 = vpandq_avx512f(auVar39,auVar10);
    auVar45 = vpsrlw_avx512bw(auVar45,2);
    auVar37 = vpandq_avx512f(auVar37,auVar10);
    auVar45 = vpandq_avx512f(auVar45,auVar10);
    auVar35 = vpaddb_avx512bw(auVar37,auVar35);
    auVar37 = vpaddb_avx512bw(auVar44,auVar46);
    auVar39 = vpsrlw_avx512bw(auVar39,2);
    auVar44 = vpandq_avx512f(auVar28,auVar10);
    auVar28 = vpsrlw_avx512bw(auVar28,2);
    auVar39 = vpandq_avx512f(auVar39,auVar10);
    auVar46 = vpandq_avx512f(auVar30,auVar10);
    auVar30 = vpsrlw_avx512bw(auVar30,2);
    auVar28 = vpandq_avx512f(auVar28,auVar10);
    auVar30 = vpandq_avx512f(auVar30,auVar10);
    auVar39 = vpaddb_avx512bw(auVar45,auVar39);
    auVar44 = vpaddb_avx512bw(auVar46,auVar44);
    auVar45 = vpandq_avx512f(auVar34,auVar10);
    auVar34 = vpsrlw_avx512bw(auVar34,2);
    auVar28 = vpaddb_avx512bw(auVar30,auVar28);
    auVar30 = vpandq_avx512f(auVar32,auVar10);
    auVar34 = vpandq_avx512f(auVar34,auVar10);
    auVar30 = vpaddb_avx512bw(auVar45,auVar30);
    auVar32 = vpsrlw_avx512bw(auVar32,2);
    auVar45 = vpandq_avx512f(auVar38,auVar10);
    auVar32 = vpandq_avx512f(auVar32,auVar10);
    auVar32 = vpaddb_avx512bw(auVar34,auVar32);
    auVar34 = vpandq_avx512f(auVar36,auVar10);
    auVar34 = vpaddb_avx512bw(auVar45,auVar34);
    auVar36 = vpsrlw_avx512bw(auVar36,2);
    auVar38 = vpsrlw_avx512bw(auVar38,2);
    auVar45 = vpandq_avx512f(auVar41,auVar10);
    auVar41 = vpsrlw_avx512bw(auVar41,2);
    auVar36 = vpandq_avx512f(auVar36,auVar10);
    auVar38 = vpandq_avx512f(auVar38,auVar10);
    auVar41 = vpandq_avx512f(auVar41,auVar10);
    auVar36 = vpaddb_avx512bw(auVar38,auVar36);
    auVar38 = vpandq_avx512f(auVar40,auVar10);
    auVar40 = vpsrlw_avx512bw(auVar40,2);
    auVar46 = vpandq_avx512f(auVar43,auVar11);
    auVar43 = vpsrlw_avx512bw(auVar43,4);
    auVar38 = vpaddb_avx512bw(auVar45,auVar38);
    auVar45 = vpandq_avx512f(auVar29,auVar11);
    auVar29 = vpsrlw_avx512bw(auVar29,4);
    auVar40 = vpandq_avx512f(auVar40,auVar10);
    auVar43 = vpandq_avx512f(auVar43,auVar11);
    auVar29 = vpandq_avx512f(auVar29,auVar11);
    auVar40 = vpaddb_avx512bw(auVar41,auVar40);
    auVar41 = vpaddb_avx512bw(auVar45,auVar46);
    auVar45 = vpandq_avx512f(auVar37,auVar11);
    auVar29 = vpaddb_avx512bw(auVar29,auVar43);
    auVar43 = vpandq_avx512f(auVar33,auVar11);
    auVar33 = vpsrlw_avx512bw(auVar33,4);
    auVar43 = vpaddb_avx512bw(auVar45,auVar43);
    auVar37 = vpsrlw_avx512bw(auVar37,4);
    auVar33 = vpandq_avx512f(auVar33,auVar11);
    auVar45 = vpandq_avx512f(auVar30,auVar11);
    auVar30 = vpsrlw_avx512bw(auVar30,4);
    auVar37 = vpandq_avx512f(auVar37,auVar11);
    auVar33 = vpaddb_avx512bw(auVar37,auVar33);
    auVar37 = vpandq_avx512f(auVar44,auVar11);
    auVar44 = vpsrlw_avx512bw(auVar44,4);
    auVar30 = vpandq_avx512f(auVar30,auVar11);
    auVar46 = vpsrlw_avx512bw(auVar34,4);
    auVar44 = vpandq_avx512f(auVar44,auVar11);
    auVar37 = vpaddb_avx512bw(auVar45,auVar37);
    auVar45 = vpandq_avx512f(auVar38,auVar11);
    auVar30 = vpaddb_avx512bw(auVar30,auVar44);
    auVar34 = vpandq_avx512f(auVar34,auVar11);
    auVar44 = vpandq_avx512f(auVar46,auVar11);
    auVar46 = vpandq_avx512f(auVar31,auVar11);
    auVar34 = vpaddb_avx512bw(auVar45,auVar34);
    auVar38 = vpsrlw_avx512bw(auVar38,4);
    auVar45 = vpandq_avx512f(auVar36,auVar11);
    auVar36 = vpsrlw_avx512bw(auVar36,4);
    auVar38 = vpandq_avx512f(auVar38,auVar11);
    auVar36 = vpandq_avx512f(auVar36,auVar11);
    auVar38 = vpaddb_avx512bw(auVar38,auVar44);
    auVar44 = vpandq_avx512f(auVar25,auVar11);
    auVar25 = vpsrlw_avx512bw(auVar25,4);
    auVar44 = vpaddb_avx512bw(auVar46,auVar44);
    auVar31 = vpsrlw_avx512bw(auVar31,4);
    auVar25 = vpandq_avx512f(auVar25,auVar11);
    auVar46 = vpandq_avx512f(auVar39,auVar11);
    auVar31 = vpandq_avx512f(auVar31,auVar11);
    auVar25 = vpaddb_avx512bw(auVar31,auVar25);
    auVar31 = vpandq_avx512f(auVar35,auVar11);
    auVar35 = vpsrlw_avx512bw(auVar35,4);
    auVar31 = vpaddb_avx512bw(auVar46,auVar31);
    auVar39 = vpsrlw_avx512bw(auVar39,4);
    auVar35 = vpandq_avx512f(auVar35,auVar11);
    auVar46 = vpandq_avx512f(auVar28,auVar11);
    auVar47 = vpandq_avx512f(auVar32,auVar11);
    auVar28 = vpsrlw_avx512bw(auVar28,4);
    auVar39 = vpandq_avx512f(auVar39,auVar11);
    auVar35 = vpaddb_avx512bw(auVar39,auVar35);
    auVar39 = vpaddb_avx512bw(auVar47,auVar46);
    auVar32 = vpsrlw_avx512bw(auVar32,4);
    auVar28 = vpandq_avx512f(auVar28,auVar11);
    auVar46 = vpandq_avx512f(auVar40,auVar11);
    auVar40 = vpsrlw_avx512bw(auVar40,4);
    auVar32 = vpandq_avx512f(auVar32,auVar11);
    auVar40 = vpandq_avx512f(auVar40,auVar11);
    auVar28 = vpaddb_avx512bw(auVar32,auVar28);
    auVar32 = vpaddb_avx512bw(auVar46,auVar45);
    auVar45 = vpandq_avx512f(auVar41,auVar27);
    auVar46 = vpandq_avx512f(auVar43,auVar27);
    auVar36 = vpaddb_avx512bw(auVar40,auVar36);
    auVar40 = vpsrlw_avx512bw(auVar41,8);
    auVar41 = vpsrlw_avx512bw(auVar43,8);
    auVar43 = vpaddb_avx512bw(auVar46,auVar45);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar40 = vpaddb_avx512bw(auVar41,auVar40);
    auVar41 = vpandq_avx512f(auVar34,auVar27);
    auVar45 = vpsrlw_avx512bw(auVar37,8);
    auVar12 = vpaddw_avx512bw(auVar12,auVar43);
    auVar20 = vpaddw_avx512bw(auVar20,auVar40);
    auVar37 = vpandq_avx512f(auVar37,auVar27);
    auVar40 = vmovdqa64_avx512f(auVar42);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar37 = vpaddb_avx512bw(auVar41,auVar37);
    auVar34 = vpsrlw_avx512bw(auVar34,8);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar13 = vpaddw_avx512bw(auVar13,auVar37);
    auVar34 = vpaddb_avx512bw(auVar34,auVar45);
    auVar37 = vpandq_avx512f(auVar44,auVar27);
    auVar41 = vpandq_avx512f(auVar31,auVar27);
    auVar42 = vpsrlw_avx512bw(auVar44,8);
    auVar21 = vpaddw_avx512bw(auVar21,auVar34);
    auVar34 = vpaddb_avx512bw(auVar41,auVar37);
    auVar37 = vmovdqa64_avx512f(auVar22);
    auVar22 = vpsrlw_avx512bw(auVar31,8);
    auVar24 = vmovdqa64_avx512f(auVar24);
    auVar14 = vpaddw_avx512bw(auVar14,auVar34);
    auVar22 = vpaddb_avx512bw(auVar22,auVar42);
    auVar31 = vpandq_avx512f(auVar32,auVar27);
    auVar22 = vpaddw_avx512bw(auVar40,auVar22);
    auVar34 = vpandq_avx512f(auVar39,auVar27);
    auVar31 = vpaddb_avx512bw(auVar31,auVar34);
    auVar32 = vpsrlw_avx512bw(auVar32,8);
    auVar34 = vpsrlw_avx512bw(auVar29,8);
    auVar15 = vpaddw_avx512bw(auVar15,auVar31);
    auVar31 = vpsrlw_avx512bw(auVar39,8);
    auVar39 = vmovdqa64_avx512f(auVar23);
    auVar23 = vpaddb_avx512bw(auVar32,auVar31);
    auVar31 = vpandq_avx512f(auVar33,auVar27);
    auVar23 = vpaddw_avx512bw(auVar37,auVar23);
    auVar29 = vpandq_avx512f(auVar29,auVar27);
    auVar26 = vmovdqa64_avx512f(auVar26);
    auVar29 = vpaddb_avx512bw(auVar31,auVar29);
    auVar31 = vpsrlw_avx512bw(auVar33,8);
    auVar32 = vpandq_avx512f(auVar30,auVar27);
    auVar30 = vpsrlw_avx512bw(auVar30,8);
    auVar16 = vpaddw_avx512bw(auVar16,auVar29);
    auVar29 = vpaddb_avx512bw(auVar31,auVar34);
    auVar31 = vpandq_avx512f(auVar38,auVar27);
    auVar24 = vpaddw_avx512bw(auVar24,auVar29);
    auVar29 = vpaddb_avx512bw(auVar31,auVar32);
    auVar31 = vpsrlw_avx512bw(auVar38,8);
    auVar32 = vpandq_avx512f(auVar25,auVar27);
    auVar33 = vpsrlw_avx512bw(auVar25,8);
    auVar17 = vpaddw_avx512bw(auVar17,auVar29);
    auVar25 = vpaddb_avx512bw(auVar31,auVar30);
    auVar29 = vpandq_avx512f(auVar35,auVar27);
    local_380 = vmovdqa64_avx512f(auVar24);
    auVar25 = vpaddw_avx512bw(auVar39,auVar25);
    auVar29 = vpaddb_avx512bw(auVar29,auVar32);
    auVar30 = vpsrlw_avx512bw(auVar35,8);
    auVar31 = vpandq_avx512f(auVar28,auVar27);
    auVar18 = vpaddw_avx512bw(auVar18,auVar29);
    auVar29 = vpaddb_avx512bw(auVar30,auVar33);
    auVar30 = vpandq_avx512f(auVar36,auVar27);
    auVar28 = vpsrlw_avx512bw(auVar28,8);
    local_340 = vmovdqa64_avx512f(auVar25);
    auVar26 = vpaddw_avx512bw(auVar26,auVar29);
    auVar29 = vpaddb_avx512bw(auVar30,auVar31);
    auVar30 = vpsrlw_avx512bw(auVar36,8);
    auVar31 = vmovdqa64_avx512f(local_6c0);
    auVar19 = vpaddw_avx512bw(auVar19,auVar29);
    auVar28 = vpaddb_avx512bw(auVar30,auVar28);
    local_300 = vmovdqa64_avx512f(auVar26);
    auVar28 = vpaddw_avx512bw(auVar31,auVar28);
    local_2c0 = vmovdqa64_avx512f(auVar28);
    local_6c0._0_8_ = local_2c0._0_8_;
    local_6c0._8_8_ = local_2c0._8_8_;
    local_6c0._16_8_ = local_2c0._16_8_;
    local_6c0._24_8_ = local_2c0._24_8_;
    local_6c0._32_8_ = local_2c0._32_8_;
    local_6c0._40_8_ = local_2c0._40_8_;
    local_6c0._48_8_ = local_2c0._48_8_;
    local_6c0._56_8_ = local_2c0._56_8_;
    local_2c0._0_8_ = local_6c0._0_8_;
    local_2c0._8_8_ = local_6c0._8_8_;
    local_2c0._16_8_ = local_6c0._16_8_;
    local_2c0._24_8_ = local_6c0._24_8_;
    local_2c0._32_8_ = local_6c0._32_8_;
    local_2c0._40_8_ = local_6c0._40_8_;
    local_2c0._48_8_ = local_6c0._48_8_;
    local_2c0._56_8_ = local_6c0._56_8_;
  }
  local_680 = vmovdqa64_avx512f(auVar12);
  local_640 = vmovdqa64_avx512f(auVar13);
  local_600 = vmovdqa64_avx512f(auVar14);
  local_5c0 = vmovdqa64_avx512f(auVar15);
  local_580 = vmovdqa64_avx512f(auVar16);
  local_540 = vmovdqa64_avx512f(auVar17);
  local_500 = vmovdqa64_avx512f(auVar18);
  local_4c0 = vmovdqa64_avx512f(auVar19);
  local_480 = vmovdqa64_avx512f(auVar20);
  local_440 = vmovdqa64_avx512f(auVar21);
  local_400 = vmovdqa64_avx512f(auVar22);
  local_3c0 = vmovdqa64_avx512f(auVar23);
  for (; uVar5 < len; uVar5 = uVar5 + 1) {
    uVar1 = array[uVar5];
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      flags[lVar3] = flags[lVar3] + (uint)((uVar1 >> ((uint)lVar3 & 0x1f) & 1) != 0);
    }
  }
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    lVar8 = 0;
    auVar9 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_680 + lVar3 * 0x40));
    local_a0[0] = vmovdqu64_avx512f(auVar9);
    uVar7 = flags[lVar3];
    for (; lVar8 != 0x20; lVar8 = lVar8 + 1) {
      uVar7 = uVar7 + *(ushort *)(local_a0[0] + lVar8 * 2);
    }
    flags[lVar3] = uVar7;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_adder_forest(const uint16_t* array, uint32_t len, uint32_t* flags) {
    __m512i counters[16];

    for (size_t i = 0; i < 16; ++i) {
        counters[i] = _mm512_setzero_si512();
    }

    const __m512i mask1bit = _mm512_set1_epi16(0x5555); // 0101010101010101 Pattern: 01
    const __m512i mask2bit = _mm512_set1_epi16(0x3333); // 0011001100110011 Pattern: 0011
    const __m512i mask4bit = _mm512_set1_epi16(0x0F0F); // 0000111100001111 Pattern: 00001111
    const __m512i mask8bit = _mm512_set1_epi16(0x00FF); // 0000000011111111 Pattern: 0000000011111111
    
    const uint32_t n_cycles = len / (2048 * (16*32));
    const uint32_t n_total  = len / (16*32);
    uint16_t tmp[32];

/*------ Macros --------*/
#define LE(i,p,k)  const __m512i sum##p##k##_##i##bit_even = _mm512_add_epi8(input##p & mask##i##bit, input##k & mask##i##bit);
#define LO(i,p,k)  const __m512i sum##p##k##_##i##bit_odd  = _mm512_add_epi8(_mm512_srli_epi16(input##p, i) & mask##i##bit, _mm512_srli_epi16(input##k, i) & mask##i##bit);

#define LBLOCK(i)           \
    LE(i,0,1)   LO(i,0,1)   \
    LE(i,2,3)   LO(i,2,3)   \
    LE(i,4,5)   LO(i,4,5)   \
    LE(i,6,7)   LO(i,6,7)   \
    LE(i,8,9)   LO(i,8,9)   \
    LE(i,10,11) LO(i,10,11) \
    LE(i,12,13) LO(i,12,13) \
    LE(i,14,15) LO(i,14,15) \

#define EVEN(b,i,k,p) input##i = sum##k##p##_##b##bit_even;
#define ODD(b,i,k,p)  input##i = sum##k##p##_##b##bit_odd;

#define UPDATE(i)                                                  \
    EVEN(i,0,0,1) EVEN(i,1,2,3)   EVEN(i,2,4,5)   EVEN(i,3,6,7)    \
    EVEN(i,4,8,9) EVEN(i,5,10,11) EVEN(i,6,12,13) EVEN(i,7,14,15)  \
     ODD(i,8,0,1)  ODD(i,9,2,3)    ODD(i,10,4,5)   ODD(i,11,6,7)   \
     ODD(i,12,8,9) ODD(i,13,10,11) ODD(i,14,12,13) ODD(i,15,14,15) \

#define UE(i,p,k) counters[i] = _mm512_add_epi16(counters[i], sum##p##k##_8bit_even);
#define UO(i,p,k) counters[i] = _mm512_add_epi16(counters[i], sum##p##k##_8bit_odd);

/*------ Start --------*/
#define L(p) __m512i input##p = _mm512_loadu_si512((__m512i*)(array + i*2048*512 + j*512 + p*32));
    size_t i = 0;
    for (/**/; i < n_cycles; ++i) {
        for (int j = 0; j < 2048; ++j) {
            // Load 16 registers.
            L(0)  L(1)  L(2)  L(3)  
            L(4)  L(5)  L(6)  L(7) 
            L(8)  L(9)  L(10) L(11) 
            L(12) L(13) L(14) L(15)

            // Perform updates for bits {1,2,4,8}.
            LBLOCK(1) UPDATE(1)
            LBLOCK(2) UPDATE(2)
            LBLOCK(4) UPDATE(4)
            LBLOCK(8) UPDATE(8)

            // Update accumulators.
            UE( 0,0,1) UE( 1, 2, 3) UE( 2, 4, 5) UE( 3, 6, 7)  
            UE( 4,8,9) UE( 5,10,11) UE( 6,12,13) UE( 7,14,15) 
            UO( 8,0,1) UO( 9, 2, 3) UO(10, 4, 5) UO(11, 6, 7) 
            UO(12,8,9) UO(13,10,11) UO(14,12,13) UO(15,14,15)
        }

        // Update.
        for (size_t i = 0; i < 16; ++i) {
            _mm512_storeu_si512((__m512i*)tmp, counters[i]);
            for (int j = 0; j < 32; ++j) flags[i] += tmp[j];
        }
        // Reset.
        for (size_t i = 0; i < 16; ++i) {
            counters[i] = _mm512_setzero_si512();
        }
    }
#undef L
#define L(p) __m512i input##p = _mm512_loadu_si512((__m512i*)(array + i*512 + p*32));
    i *= 2048;
    for (/**/; i < n_total; ++i) {
        // Load 16 registers.
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 
        L(8)  L(9)  L(10) L(11) 
        L(12) L(13) L(14) L(15)

        // Perform updates for bits {1,2,4,8}.
        LBLOCK(1) UPDATE(1)
        LBLOCK(2) UPDATE(2)
        LBLOCK(4) UPDATE(4)
        LBLOCK(8) UPDATE(8)

        // Update accumulators.
        UE( 0,0,1) UE( 1, 2, 3) UE( 2, 4, 5) UE( 3, 6, 7)  
        UE( 4,8,9) UE( 5,10,11) UE( 6,12,13) UE( 7,14,15) 
        UO( 8,0,1) UO( 9, 2, 3) UO(10, 4, 5) UO(11, 6, 7) 
        UO(12,8,9) UO(13,10,11) UO(14,12,13) UO(15,14,15)
    }

    i *= 512;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef UPDATE
#undef ODD
#undef EVEN
#undef LBLOCK
#undef LE
#undef LO
#undef UO
#undef UE

    for (size_t i = 0; i < 16; ++i) {
        _mm512_storeu_si512((__m512i*)tmp, counters[i]);
        for (int j = 0; j < 32; ++j) flags[i] += tmp[j];
    }
    return 0;
}